

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c++
# Opt level: O1

ssize_t __thiscall kj::FdOutputStream::write(FdOutputStream *this,int __fd,void *__buf,size_t __n)

{
  size_t *psVar1;
  iovec *piVar2;
  size_t sVar3;
  int iVar4;
  iovec *__iovec;
  undefined4 extraout_var;
  long lVar5;
  uint uVar6;
  undefined4 in_register_00000034;
  undefined1 *puVar7;
  long lVar8;
  iovec *piVar9;
  ssize_t n;
  Array<iovec> iov_heap;
  Fault f_1;
  Fault f;
  iovec iov_stack [16];
  
  lVar8 = CONCAT44(in_register_00000034,__fd);
  if ((void *)0x400 < __buf) {
    do {
      (*(this->super_OutputStream)._vptr_OutputStream[3])(this,lVar8,0x400);
      lVar8 = lVar8 + 0x4000;
      __buf = (void *)((long)__buf + -0x400);
    } while ((undefined1 *)0x400 < __buf);
  }
  if (&DAT_00000010 < __buf) {
    __iovec = (iovec *)kj::_::HeapArrayDisposer::allocateImpl
                                 (0x10,(size_t)__buf,(size_t)__buf,(_func_void_void_ptr *)0x0,
                                  (_func_void_void_ptr *)0x0);
    iov_heap.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    iov_heap.ptr = (iovec *)__iovec;
    iov_heap.size_ = (size_t)__buf;
  }
  else {
    iov_heap.ptr = (iovec *)0x0;
    iov_heap.size_ = 0;
    iov_heap.disposer = (ArrayDisposer *)0x0;
    __iovec = (iovec *)iov_stack;
  }
  if ((undefined1 *)__buf != (undefined1 *)0x0) {
    lVar5 = 8;
    uVar6 = 1;
    do {
      *(undefined8 *)((long)__iovec + lVar5 + -8) = *(undefined8 *)(lVar8 + -8 + lVar5);
      *(undefined8 *)((long)&__iovec->iov_base + lVar5) = *(undefined8 *)(lVar8 + lVar5);
      puVar7 = (undefined1 *)(ulong)uVar6;
      lVar5 = lVar5 + 0x10;
      uVar6 = uVar6 + 1;
    } while (puVar7 < __buf);
  }
  piVar9 = __iovec + (long)__buf;
  piVar2 = iov_heap.ptr;
  sVar3 = iov_heap.size_;
  if (0 < (long)__buf) {
    do {
      if (__iovec->iov_len != 0) break;
      __iovec = __iovec + 1;
    } while (__iovec < piVar9);
  }
  do {
    if (piVar9 <= __iovec) {
      if (piVar2 != (iovec *)0x0) {
        iov_heap.ptr = (iovec *)0x0;
        iov_heap.size_ = 0;
        iVar4 = (**(iov_heap.disposer)->_vptr_ArrayDisposer)
                          (iov_heap.disposer,piVar2,0x10,sVar3,sVar3,0);
        __buf = (void *)CONCAT44(extraout_var,iVar4);
      }
      return (ssize_t)__buf;
    }
    n = 0;
    iov_heap.ptr = piVar2;
    iov_heap.size_ = sVar3;
    do {
      n = writev(this->fd,__iovec,(int)((ulong)((long)piVar9 - (long)__iovec) >> 4));
      if (-1 < n) {
        iVar4 = 0;
        break;
      }
      iVar4 = kj::_::Debug::getOsErrorNumber(false);
    } while (iVar4 == -1);
    if (iVar4 != 0) {
      kj::_::Debug::Fault::Fault<int,int&>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/io.c++"
                 ,0x1c3,iVar4,"n = ::writev(fd, current, iovCount)","fd",&this->fd);
      kj::_::Debug::Fault::fatal(&f);
    }
    f.exception = (Exception *)&n;
    __buf = (void *)n;
    if (n < 1) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<long&,int>&,char_const(&)[24]>
                (&f_1,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/io.c++"
                 ,0x1c4,FAILED,"n > 0","_kjCondition,\"writev() returned zero.\"",
                 (DebugComparison<long_&,_int> *)&f,(char (*) [24])"writev() returned zero.");
      kj::_::Debug::Fault::fatal(&f_1);
    }
    for (; (__iovec < piVar9 && (psVar1 = &__iovec->iov_len, (undefined1 *)*psVar1 <= __buf));
        __iovec = __iovec + 1) {
      __buf = (undefined1 *)((long)__buf + -*psVar1);
    }
    n = (ssize_t)__buf;
    piVar2 = iov_heap.ptr;
    sVar3 = iov_heap.size_;
    if (0 < (long)__buf) {
      __iovec->iov_base = (undefined1 *)((long)__buf + (long)__iovec->iov_base);
      __iovec->iov_len = __iovec->iov_len - (long)__buf;
    }
  } while( true );
}

Assistant:

void FdOutputStream::write(ArrayPtr<const ArrayPtr<const byte>> pieces) {
#if _WIN32
  // Windows has no reasonable writev(). It has WriteFileGather, but this call has the unreasonable
  // restriction that each segment must be page-aligned. So, fall back to the default implementation
  for (auto piece: pieces) write(piece);
#else
  const size_t iovmax = miniposix::iovMax();
  while (pieces.size() > iovmax) {
    write(pieces.first(iovmax));
    pieces = pieces.slice(iovmax, pieces.size());
  }

  KJ_STACK_ARRAY(struct iovec, iov, pieces.size(), 16, 128);

  for (uint i = 0; i < pieces.size(); i++) {
    // writev() interface is not const-correct.  :(
    iov[i].iov_base = const_cast<byte*>(pieces[i].begin());
    iov[i].iov_len = pieces[i].size();
  }

  struct iovec* current = iov.begin();

  // Advance past any leading empty buffers so that a write full of only empty buffers does not
  // cause a syscall at all.
  while (current < iov.end() && current->iov_len == 0) {
    ++current;
  }

  while (current < iov.end()) {
    size_t iovCount = iov.end() - current;

#if __APPLE__
    // MacOS will fail if you give it more than INT_MAX bytes to write at once. We can solve this
    // by carefully truncating the list to a lesser number. Why the OS doesn't just return a short
    // write itself, I don't know.
    size_t totalSize = 0;
    struct iovec* editedPiece = nullptr;
    size_t editedPieceOriginalLen = 0;
    for (auto i: kj::zeroTo(iovCount)) {
      auto& piece = *(current + i);
      totalSize += piece.iov_len;
      if (totalSize >= WRITE_CLAMP_SIZE) {
        // Truncate the list after this piece.
        iovCount = i + 1;

        if (totalSize > WRITE_CLAMP_SIZE) {
          // We also have to truncate this piece. Patch it in-place and plan to fix it later.
          editedPiece = &piece;
          editedPieceOriginalLen = piece.iov_len;
          size_t overage = totalSize - WRITE_CLAMP_SIZE;
          piece.iov_len -= overage;
        }

        break;
      }
    }
#endif

    // Issue the write.
    ssize_t n = 0;
    KJ_SYSCALL(n = ::writev(fd, current, iovCount), fd);
    KJ_ASSERT(n > 0, "writev() returned zero.");

#if __APPLE__
    // If we patched the list above, unpatch now.
    if (editedPiece != nullptr) {
      editedPiece->iov_len = editedPieceOriginalLen;
    }
#endif

    // Advance past all buffers that were fully-written.
    while (current < iov.end() && static_cast<size_t>(n) >= current->iov_len) {
      n -= current->iov_len;
      ++current;
    }

    // If we only partially-wrote one of the buffers, adjust the pointer and size to include only
    // the unwritten part.
    if (n > 0) {
      current->iov_base = reinterpret_cast<byte*>(current->iov_base) + n;
      current->iov_len -= n;
    }
  }
#endif
}